

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQString * __thiscall SQStringTable::Add(SQStringTable *this,SQChar *news,SQInteger len)

{
  char cVar1;
  SQString **ppSVar2;
  int iVar3;
  ulong uVar4;
  SQString *pSVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (len < 0) {
    len = strlen(news);
  }
  uVar4 = (ulong)len >> 5 | 1;
  pcVar6 = news;
  uVar8 = len;
  for (uVar7 = len; uVar4 <= uVar7; uVar7 = uVar7 - uVar4) {
    cVar1 = *pcVar6;
    pcVar6 = pcVar6 + 1;
    uVar8 = uVar8 ^ (ulong)(ushort)(short)cVar1 + (uVar8 >> 2) + uVar8 * 0x20;
  }
  uVar7 = this->_numofslots - 1 & uVar8;
  pSVar5 = this->_strings[uVar7];
  while( true ) {
    if (pSVar5 == (SQString *)0x0) {
      pSVar5 = (SQString *)sq_vm_malloc(len + 0x40);
      (pSVar5->super_SQRefCounted)._uiRef = 0;
      (pSVar5->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
      (pSVar5->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQRefCounted_001490e8;
      pSVar5->_sharedstate = this->_sharedstate;
      memcpy(pSVar5->_val,news,len);
      pSVar5->_val[len] = '\0';
      pSVar5->_len = len;
      pSVar5->_hash = uVar8;
      ppSVar2 = this->_strings;
      pSVar5->_next = ppSVar2[uVar7];
      ppSVar2[uVar7] = pSVar5;
      uVar8 = this->_slotused + 1;
      this->_slotused = uVar8;
      if (this->_numofslots < uVar8) {
        Resize(this,this->_numofslots * 2);
      }
      return pSVar5;
    }
    if ((pSVar5->_len == len) && (iVar3 = bcmp(news,pSVar5->_val,len), iVar3 == 0)) break;
    pSVar5 = pSVar5->_next;
  }
  return pSVar5;
}

Assistant:

SQString *SQStringTable::Add(const SQChar *news,SQInteger len)
{
    if(len<0)
        len = (SQInteger)scstrlen(news);
    SQHash newhash = ::_hashstr(news,len);
    SQHash h = newhash&(_numofslots-1);
    SQString *s;
    for (s = _strings[h]; s; s = s->_next){
        if(s->_len == len && (!memcmp(news,s->_val,sq_rsl(len))))
            return s; //found
    }

    SQString *t = (SQString *)SQ_MALLOC(sq_rsl(len)+sizeof(SQString));
    new (t) SQString;
    t->_sharedstate = _sharedstate;
    memcpy(t->_val,news,sq_rsl(len));
    t->_val[len] = _SC('\0');
    t->_len = len;
    t->_hash = newhash;
    t->_next = _strings[h];
    _strings[h] = t;
    _slotused++;
    if (_slotused > _numofslots)  /* too crowded? */
        Resize(_numofslots*2);
    return t;
}